

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  int _c;
  undefined8 in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  undefined8 local_308;
  undefined8 local_300;
  undefined4 local_2e0;
  undefined4 local_2d4;
  undefined8 local_2c8;
  void *local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long local_288;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  Mat *in_stack_fffffffffffffd98;
  undefined4 *local_260;
  int local_258;
  void *local_248;
  int *local_240;
  long local_238;
  long *local_228;
  int local_21c;
  int local_218;
  long local_208;
  int local_1fc;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  undefined8 *local_1d8;
  undefined8 *local_1c8;
  void **local_1b8;
  int local_198;
  undefined4 local_194;
  void **local_190;
  undefined8 *local_170;
  undefined8 *local_150;
  undefined1 local_145;
  int local_144;
  void **local_140;
  undefined8 *local_138;
  undefined1 local_115;
  int local_114;
  undefined8 *local_108;
  undefined8 *local_e8;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined4 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  void *local_40;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20);
  local_1fc = in_R8D * in_R9D;
  local_1f0 = in_ECX;
  local_1ec = in_EDX;
  local_1e8 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd8c,
               (Allocator *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Mat::create(in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
              (int)in_stack_fffffffffffffcb8,_c,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0)
  ;
  for (local_258 = 0; local_258 + 7 < local_1f0; local_258 = local_258 + 8) {
    local_114 = local_258 / 8;
    local_108 = &local_2a8;
    local_64 = *(int *)((long)local_1e8 + 0x2c);
    local_68 = (int)local_1e8[6];
    local_6c = *(undefined4 *)((long)local_1e8 + 0x34);
    local_78 = (undefined4 *)(*local_1e8 + local_1e8[8] * (long)local_114 * local_1e8[2]);
    local_80 = local_1e8[2];
    local_84 = (undefined4)local_1e8[3];
    local_90 = local_1e8[4];
    local_60 = &local_2a8;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_e8 = &local_2a8;
    local_1d8 = &local_2a8;
    local_c = 0x10;
    local_115 = 1;
    local_2a8 = 0;
    local_298 = 0;
    local_290 = 0;
    local_2a0 = 0;
    local_260 = local_78;
    for (local_2ac = 0; local_2ac + 7 < local_1ec; local_2ac = local_2ac + 8) {
      for (local_2b0 = 0; local_2b0 < local_1fc; local_2b0 = local_2b0 + 1) {
        for (local_2b4 = 0; local_2b4 < 8; local_2b4 = local_2b4 + 1) {
          for (local_2b8 = 0; local_2b8 < 8; local_2b8 = local_2b8 + 1) {
            local_144 = local_258 + local_2b8;
            local_138 = &local_308;
            local_140 = &local_248;
            local_40 = (void *)((long)local_248 + local_208 * local_144 * local_238);
            local_28 = &local_308;
            local_18 = (long)local_21c * (long)local_218 * local_238;
            local_9c = local_2ac + local_2b4;
            local_98 = &local_308;
            local_2c0 = (void *)((long)local_40 + (long)local_21c * (long)local_9c * local_238);
            local_1c8 = &local_308;
            local_1c = 0x10;
            local_145 = 1;
            local_308 = 0;
            local_2e0 = 0;
            local_2d4 = 0;
            local_2c8 = 0;
            local_300 = 0;
            *local_260 = *(undefined4 *)((long)local_2c0 + (long)local_2b0 * 4);
            local_260 = local_260 + 1;
            local_170 = local_1c8;
          }
        }
      }
    }
    local_150 = local_1d8;
    local_288 = local_90;
  }
  local_1b8 = &local_248;
  if (local_240 != (int *)0x0) {
    local_194 = 0xffffffff;
    LOCK();
    local_198 = *local_240;
    *local_240 = *local_240 + -1;
    UNLOCK();
    if (local_198 == 1) {
      local_190 = local_1b8;
      if (local_228 == (long *)0x0) {
        if (local_248 != (void *)0x0) {
          free(local_248);
        }
      }
      else {
        (**(code **)(*local_228 + 0x18))(local_228,local_248);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-8a-maxk-inch/8a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(64 * maxk, inch / 8, outch / 8, (size_t)4u);

    for (int q = 0; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}